

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsPosixTestProcess.cpp
# Opt level: O0

void __thiscall xs::posix::PipeReader::stop(PipeReader *this)

{
  bool bVar1;
  PipeReader *this_local;
  
  bVar1 = de::Thread::isStarted(&this->super_Thread);
  if (bVar1) {
    de::Thread::join(&this->super_Thread);
    this->m_file = (deFile *)0x0;
  }
  return;
}

Assistant:

void PipeReader::stop (void)
{
	if (!isStarted())
		return; // Nothing to do.

	// Buffer must be in canceled state or otherwise stopping reader might block.
	DE_ASSERT(m_buf->isCanceled());

	// Join thread.
	join();

	m_file = DE_NULL;
}